

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TFunction * __thiscall
glslang::HlslParseContext::findFunction
          (HlslParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn,int *thisDepth,
          TIntermTyped **args)

{
  TSymbolTable *pTVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  TOperator TVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TSymbol *pTVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TFunction *pTVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TPoolAllocator *pTVar12;
  TIntermAggregate *this_00;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TIntermTyped *pTVar13;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar14;
  TType *pTVar15;
  undefined4 extraout_var_18;
  long lVar16;
  long *plVar17;
  TType *pTVar18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined8 uVar19;
  char *pcVar20;
  _func_int **pp_Var21;
  TSourceLoc *pTVar22;
  TIntermTyped **ppTVar23;
  bool tie;
  bool allowOnlyUpConversions;
  bool dummyScope;
  TVector<const_glslang::TFunction_*> candidateList;
  TParameter param;
  TFunction convertedCall;
  bool local_312 [2];
  TIntermTyped **local_310;
  bool local_301;
  TSourceLoc *local_300;
  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_> local_2f8
  ;
  TParameter local_2d0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_> local_1f0
  ;
  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_> local_1d0
  ;
  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_> local_1b0
  ;
  undefined1 local_190 [352];
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  local_310 = args;
  iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  bVar5 = TSymbolTable::isFunctionNameVariable(pTVar1,(TString *)CONCAT44(extraout_var,iVar6));
  if (bVar5) {
    iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
    uVar19 = *(undefined8 *)(CONCAT44(extraout_var_00,iVar6) + 8);
    pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar20 = "can\'t use function syntax on variable";
LAB_0038dc25:
    (*pp_Var21[0x2d])(this,loc,pcVar20,uVar19,"");
    return (TFunction *)0x0;
  }
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  local_300 = loc;
  iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  pTVar10 = TSymbolTable::find(pTVar1,(TString *)CONCAT44(extraout_var_01,iVar6),builtIn,&local_301,
                               thisDepth);
  if (pTVar10 != (TSymbol *)0x0) {
LAB_0038dc60:
    iVar6 = (*pTVar10->_vptr_TSymbol[7])(pTVar10);
    return (TFunction *)CONCAT44(extraout_var_02,iVar6);
  }
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  TSymbolTable::findFunctionNameList
            (pTVar1,(TString *)CONCAT44(extraout_var_03,iVar6),
             (TVector<const_glslang::TFunction_*> *)&local_2f8,builtIn);
  if ((((long)local_2f8.
              super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_2f8.
              super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) && (*builtIn == true)) &&
     (((iVar6 = (*((*local_2f8.
                     super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[0x1b])
                          (), iVar6 == 0x2d5 ||
       (((iVar6 = (*((*local_2f8.
                       super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol
                    [0x1b])(), iVar6 == 0x2d6 ||
         (iVar6 = (*((*local_2f8.
                       super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol
                    [0x1b])(), iVar6 == 0x2c9)) ||
        (iVar6 = (*((*local_2f8.
                      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[0x1b]
                 )(), iVar6 == 0x2ca)))) ||
      (iVar6 = (*((*local_2f8.
                    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[0x1b])
                         (), iVar6 == 0x2cb)))) {
    return *local_2f8.
            super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  local_312[1] = true;
  local_312[0] = false;
  iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_04,iVar6),"printf");
  if (iVar6 == 0) {
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    local_190._0_8_ = GetThreadPoolAllocator();
    local_190._8_8_ = local_190 + 0x18;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_190,
               "printf(","");
    pTVar10 = TSymbolTable::find(pTVar1,(TString *)local_190,builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar10 != (TSymbol *)0x0) goto LAB_0038dc60;
  }
  std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
  vector(&local_1b0,&local_2f8);
  local_278._M_unused._0_8_ = (undefined8)(local_312 + 1);
  local_260 = std::
              _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7574:30)>
              ::_M_invoke;
  local_268 = std::
              _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7574:30)>
              ::_M_manager;
  local_218._M_unused._M_object = (void *)0x0;
  local_218._8_8_ = 0;
  local_200 = std::
              _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7659:25)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7659:25)>
              ::_M_manager;
  local_278._8_8_ = this;
  pTVar11 = TParseContextBase::selectFunction
                      (&this->super_TParseContextBase,
                       (TVector<const_glslang::TFunction_*> *)&local_1b0,call,
                       (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>
                        *)&local_278,
                       (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                        *)&local_218,local_312);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  if (pTVar11 == (TFunction *)0x0) {
    local_312[1] = false;
    std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
    vector(&local_1d0,&local_2f8);
    local_298._M_unused._0_8_ = (undefined8)(local_312 + 1);
    local_280 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7574:30)>
                ::_M_invoke;
    local_288 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7574:30)>
                ::_M_manager;
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = 0;
    local_220 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7659:25)>
                ::_M_invoke;
    local_228 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7659:25)>
                ::_M_manager;
    local_298._8_8_ = this;
    pTVar11 = TParseContextBase::selectFunction
                        (&this->super_TParseContextBase,
                         (TVector<const_glslang::TFunction_*> *)&local_1d0,call,
                         (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>
                          *)&local_298,
                         (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                          *)&local_238,local_312);
    if (local_228 != (code *)0x0) {
      (*local_228)(&local_238,&local_238,__destroy_functor);
    }
    if (local_288 != (code *)0x0) {
      (*local_288)(&local_298,&local_298,__destroy_functor);
    }
    if (pTVar11 == (TFunction *)0x0) {
      iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
      uVar19 = *(undefined8 *)(CONCAT44(extraout_var_08,iVar6) + 8);
      pp_Var21 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar20 = "no matching overloaded function found";
      loc = local_300;
      goto LAB_0038dc25;
    }
  }
  pTVar22 = local_300;
  ppTVar23 = local_310;
  if (*builtIn == true) {
    iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
    iVar7 = (*(pTVar11->super_TSymbol)._vptr_TSymbol[6])(pTVar11);
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_05,iVar6),
                      (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_06,iVar7));
    if (iVar6 == 0) {
      return pTVar11;
    }
    if (*local_310 != (TIntermTyped *)0x0) {
      iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])(call);
      pTVar12 = GetThreadPoolAllocator();
      if (iVar6 == 1) {
        this_00 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar12,0xf8);
        TVar8 = (*(pTVar11->super_TSymbol)._vptr_TSymbol[0x1b])(pTVar11);
        TIntermUnary::TIntermUnary((TIntermUnary *)this_00,TVar8);
        iVar6 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[7])(this_00);
        iVar7 = (*((*local_310)->super_TIntermNode)._vptr_TIntermNode[3])();
        (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x180))
                  ((long *)CONCAT44(extraout_var_07,iVar6),iVar7);
      }
      else {
        this_00 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar12,0x188);
        TVar8 = (*(pTVar11->super_TSymbol)._vptr_TSymbol[0x1b])(pTVar11);
        TIntermAggregate::TIntermAggregate(this_00,TVar8);
        iVar6 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[6])(this_00);
        lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 400))
                           ((long *)CONCAT44(extraout_var_09,iVar6));
        iVar6 = (*((*local_310)->super_TIntermNode)._vptr_TIntermNode[6])();
        lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 400))
                           ((long *)CONCAT44(extraout_var_10,iVar6));
        uVar19 = *(undefined8 *)(lVar14 + 0x18);
        uVar2 = *(undefined8 *)(lVar16 + 0x10);
        uVar3 = *(undefined8 *)(lVar14 + 8);
        uVar4 = *(undefined8 *)(lVar14 + 0x10);
        *(undefined8 *)(lVar14 + 8) = *(undefined8 *)(lVar16 + 8);
        *(undefined8 *)(lVar14 + 0x10) = uVar2;
        *(undefined8 *)(lVar14 + 0x18) = *(undefined8 *)(lVar16 + 0x18);
        *(undefined8 *)(lVar16 + 8) = uVar3;
        *(undefined8 *)(lVar16 + 0x10) = uVar4;
        *(undefined8 *)(lVar16 + 0x18) = uVar19;
      }
      bVar5 = TIntermediate::promote
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         &this_00->super_TIntermOperator);
      if (!bVar5) {
        return (TFunction *)0x0;
      }
      iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])(call);
      pp_Var21 = (this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode;
      if (iVar6 == 1) {
        iVar6 = (*pp_Var21[7])();
        pTVar13 = (TIntermTyped *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x188))
                            ((long *)CONCAT44(extraout_var_11,iVar6));
        *local_310 = pTVar13;
      }
      else {
        iVar6 = (*pp_Var21[6])(this_00);
        lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 400))
                           ((long *)CONCAT44(extraout_var_12,iVar6));
        iVar6 = (*((*local_310)->super_TIntermNode)._vptr_TIntermNode[6])();
        lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar6) + 400))
                           ((long *)CONCAT44(extraout_var_13,iVar6));
        uVar19 = *(undefined8 *)(lVar14 + 0x18);
        uVar2 = *(undefined8 *)(lVar16 + 0x10);
        uVar3 = *(undefined8 *)(lVar14 + 8);
        uVar4 = *(undefined8 *)(lVar14 + 0x10);
        *(undefined8 *)(lVar14 + 8) = *(undefined8 *)(lVar16 + 8);
        *(undefined8 *)(lVar14 + 0x10) = uVar2;
        *(undefined8 *)(lVar14 + 0x18) = *(undefined8 *)(lVar16 + 0x18);
        *(undefined8 *)(lVar16 + 8) = uVar3;
        *(undefined8 *)(lVar16 + 0x10) = uVar4;
        *(undefined8 *)(lVar16 + 0x18) = uVar19;
      }
    }
    iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
    iVar7 = (*(call->super_TSymbol)._vptr_TSymbol[0xc])(call);
    TVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x1b])(call);
    ppTVar23 = local_310;
    TFunction::TFunction
              ((TFunction *)local_190,(TString *)CONCAT44(extraout_var_14,iVar6),
               (TType *)CONCAT44(extraout_var_15,iVar7),TVar8);
    iVar6 = (*((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode[6])();
    pp_Var21 = ((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode;
    if (CONCAT44(extraout_var_16,iVar6) == 0) {
      iVar6 = (*pp_Var21[7])();
      if (CONCAT44(extraout_var_20,iVar6) == 0) {
        iVar6 = (*((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode[3])();
        if (CONCAT44(extraout_var_22,iVar6) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                        ,0x1e7e,
                        "const TFunction *glslang::HlslParseContext::findFunction(const TSourceLoc &, TFunction &, bool &, int &, TIntermTyped *&)"
                       );
        }
        local_2d0.name = (TString *)0x0;
        pTVar12 = GetThreadPoolAllocator();
        pTVar15 = (TType *)TPoolAllocator::allocate(pTVar12,0x98);
        TType::TType(pTVar15,EbtVoid,EvqTemporary,1,0,0,false);
        local_2d0.defaultValue = (TIntermTyped *)0x0;
        local_2d0.type = pTVar15;
        iVar6 = (*((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode[3])();
        pTVar18 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar6) + 0xf0))
                                     ((long *)CONCAT44(extraout_var_23,iVar6));
      }
      else {
        local_2d0.name = (TString *)0x0;
        pTVar12 = GetThreadPoolAllocator();
        pTVar15 = (TType *)TPoolAllocator::allocate(pTVar12,0x98);
        TType::TType(pTVar15,EbtVoid,EvqTemporary,1,0,0,false);
        local_2d0.defaultValue = (TIntermTyped *)0x0;
        local_2d0.type = pTVar15;
        iVar6 = (*((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode[7])();
        plVar17 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar6) + 0x188))
                                    ((long *)CONCAT44(extraout_var_21,iVar6));
        plVar17 = (long *)(**(code **)(*plVar17 + 0x18))(plVar17);
        pTVar18 = (TType *)(**(code **)(*plVar17 + 0xf0))(plVar17);
      }
      TType::shallowCopy(pTVar15,pTVar18);
      TFunction::addParameter((TFunction *)local_190,&local_2d0);
    }
    else {
      iVar6 = (*pp_Var21[6])();
      lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar6) + 400))
                         ((long *)CONCAT44(extraout_var_17,iVar6));
      if (0 < (int)((ulong)(*(long *)(lVar14 + 0x10) - *(long *)(lVar14 + 8)) >> 3)) {
        lVar14 = 0;
        do {
          local_2d0.name = (TString *)0x0;
          pTVar12 = GetThreadPoolAllocator();
          pTVar15 = (TType *)TPoolAllocator::allocate(pTVar12,0x98);
          TType::TType(pTVar15,EbtVoid,EvqTemporary,1,0,0,false);
          local_2d0.defaultValue = (TIntermTyped *)0x0;
          local_2d0.type = pTVar15;
          iVar6 = (*((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode[6])();
          lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar6) + 400))
                             ((long *)CONCAT44(extraout_var_18,iVar6));
          plVar17 = (long *)(**(code **)(**(long **)(*(long *)(lVar16 + 8) + lVar14 * 8) + 0x18))();
          pTVar18 = (TType *)(**(code **)(*plVar17 + 0xf0))(plVar17);
          TType::shallowCopy(pTVar15,pTVar18);
          TFunction::addParameter((TFunction *)local_190,&local_2d0);
          lVar14 = lVar14 + 1;
          iVar6 = (*((*ppTVar23)->super_TIntermNode)._vptr_TIntermNode[6])();
          lVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 400))
                             ((long *)CONCAT44(extraout_var_19,iVar6));
        } while (lVar14 < (int)((ulong)(*(long *)(lVar16 + 0x10) - *(long *)(lVar16 + 8)) >> 3));
      }
    }
    std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
    vector(&local_1f0,&local_2f8);
    local_2b8._M_unused._0_8_ = (undefined8)(local_312 + 1);
    local_2a0 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7574:30)>
                ::_M_invoke;
    local_2a8 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7574:30)>
                ::_M_manager;
    local_258._M_unused._M_object = (void *)0x0;
    local_258._8_8_ = 0;
    local_240 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7659:25)>
                ::_M_invoke;
    local_248 = std::
                _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp:7659:25)>
                ::_M_manager;
    local_2b8._8_8_ = this;
    pTVar11 = TParseContextBase::selectFunction
                        (&this->super_TParseContextBase,
                         (TVector<const_glslang::TFunction_*> *)&local_1f0,(TFunction *)local_190,
                         (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>
                          *)&local_2b8,
                         (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                          *)&local_258,local_312);
    if (local_248 != (code *)0x0) {
      (*local_248)(&local_258,&local_258,__destroy_functor);
    }
    pTVar22 = local_300;
    ppTVar23 = local_310;
    if (local_2a8 != (code *)0x0) {
      (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
    }
    TFunction::~TFunction((TFunction *)local_190);
  }
  if (local_312[0] == true) {
    iVar6 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar22,"ambiguous best function under implicit type conversion",
               *(undefined8 *)(CONCAT44(extraout_var_24,iVar6) + 8),"");
  }
  if ((pTVar11 != (TFunction *)0x0) && ((local_312[0] & 1U) == 0)) {
    for (uVar9 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])(call);
        iVar6 = (*(pTVar11->super_TSymbol)._vptr_TSymbol[0x24])(pTVar11), (int)uVar9 < iVar6;
        uVar9 = uVar9 + 1) {
      iVar6 = (*(pTVar11->super_TSymbol)._vptr_TSymbol[0x28])(pTVar11,(ulong)uVar9);
      handleFunctionArgument
                (this,call,ppTVar23,*(TIntermTyped **)(CONCAT44(extraout_var_25,iVar6) + 0x10));
    }
  }
  return pTVar11;
}

Assistant:

const TFunction* HlslParseContext::findFunction(const TSourceLoc& loc, TFunction& call, bool& builtIn, int& thisDepth,
                                                TIntermTyped*& args)
{
    if (symbolTable.isFunctionNameVariable(call.getName())) {
        error(loc, "can't use function syntax on variable", call.getName().c_str(), "");
        return nullptr;
    }

    // first, look for an exact match
    bool dummyScope;
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn, &dummyScope, &thisDepth);
    if (symbol)
        return symbol->getAsFunction();

    // no exact match, use the generic selector, parameterized by the GLSL rules

    // create list of candidates to send
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    // These built-in ops can accept any type, so we bypass the argument selection
    if (candidateList.size() == 1 && builtIn &&
        (candidateList[0]->getBuiltInOp() == EOpMethodAppend ||
         candidateList[0]->getBuiltInOp() == EOpMethodRestartStrip ||
         candidateList[0]->getBuiltInOp() == EOpMethodIncrementCounter ||
         candidateList[0]->getBuiltInOp() == EOpMethodDecrementCounter ||
         candidateList[0]->getBuiltInOp() == EOpMethodConsume)) {
        return candidateList[0];
    }

    bool allowOnlyUpConversions = true;

    // can 'from' convert to 'to'?
    const auto convertible = [&](const TType& from, const TType& to, TOperator op, int arg) -> bool {
        if (from == to)
            return true;

        // no aggregate conversions
        if (from.isArray()  || to.isArray() ||
            from.isStruct() || to.isStruct())
            return false;

        switch (op) {
        case EOpInterlockedAdd:
        case EOpInterlockedAnd:
        case EOpInterlockedCompareExchange:
        case EOpInterlockedCompareStore:
        case EOpInterlockedExchange:
        case EOpInterlockedMax:
        case EOpInterlockedMin:
        case EOpInterlockedOr:
        case EOpInterlockedXor:
            // We do not promote the texture or image type for these ocodes.  Normally that would not
            // be an issue because it's a buffer, but we haven't decomposed the opcode yet, and at this
            // stage it's merely e.g, a basic integer type.
            //
            // Instead, we want to promote other arguments, but stay within the same family.  In other
            // words, InterlockedAdd(RWBuffer<int>, ...) will always use the int flavor, never the uint flavor,
            // but it is allowed to promote its other arguments.
            if (arg == 0)
                return false;
            break;
        case EOpMethodSample:
        case EOpMethodSampleBias:
        case EOpMethodSampleCmp:
        case EOpMethodSampleCmpLevelZero:
        case EOpMethodSampleGrad:
        case EOpMethodSampleLevel:
        case EOpMethodLoad:
        case EOpMethodGetDimensions:
        case EOpMethodGetSamplePosition:
        case EOpMethodGather:
        case EOpMethodCalculateLevelOfDetail:
        case EOpMethodCalculateLevelOfDetailUnclamped:
        case EOpMethodGatherRed:
        case EOpMethodGatherGreen:
        case EOpMethodGatherBlue:
        case EOpMethodGatherAlpha:
        case EOpMethodGatherCmp:
        case EOpMethodGatherCmpRed:
        case EOpMethodGatherCmpGreen:
        case EOpMethodGatherCmpBlue:
        case EOpMethodGatherCmpAlpha:
        case EOpMethodAppend:
        case EOpMethodRestartStrip:
            // those are method calls, the object type can not be changed
            // they are equal if the dim and type match (is dim sufficient?)
            if (arg == 0)
                return from.getSampler().type == to.getSampler().type &&
                       from.getSampler().arrayed == to.getSampler().arrayed &&
                       from.getSampler().shadow == to.getSampler().shadow &&
                       from.getSampler().ms == to.getSampler().ms &&
                       from.getSampler().dim == to.getSampler().dim;
            break;
        default:
            break;
        }

        // basic types have to be convertible
        if (allowOnlyUpConversions)
            if (! intermediate.canImplicitlyPromote(from.getBasicType(), to.getBasicType(), EOpFunctionCall))
                return false;

        // shapes have to be convertible
        if ((from.isScalarOrVec1() && to.isScalarOrVec1()) ||
            (from.isScalarOrVec1() && to.isVector())    ||
            (from.isScalarOrVec1() && to.isMatrix())    ||
            (from.isVector() && to.isVector() && from.getVectorSize() >= to.getVectorSize()))
            return true;

        // TODO: what are the matrix rules? they go here

        return false;
    };

    // Is 'to2' a better conversion than 'to1'?
    // Ties should not be considered as better.
    // Assumes 'convertible' already said true.
    const auto better = [](const TType& from, const TType& to1, const TType& to2) -> bool {
        // exact match is always better than mismatch
        if (from == to2)
            return from != to1;
        if (from == to1)
            return false;

        // shape changes are always worse
        if (from.isScalar() || from.isVector()) {
            if (from.getVectorSize() == to2.getVectorSize() &&
                from.getVectorSize() != to1.getVectorSize())
                return true;
            if (from.getVectorSize() == to1.getVectorSize() &&
                from.getVectorSize() != to2.getVectorSize())
                return false;
        }

        // Handle sampler betterness: An exact sampler match beats a non-exact match.
        // (If we just looked at basic type, all EbtSamplers would look the same).
        // If any type is not a sampler, just use the linearize function below.
        if (from.getBasicType() == EbtSampler && to1.getBasicType() == EbtSampler && to2.getBasicType() == EbtSampler) {
            // We can ignore the vector size in the comparison.
            TSampler to1Sampler = to1.getSampler();
            TSampler to2Sampler = to2.getSampler();

            to1Sampler.vectorSize = to2Sampler.vectorSize = from.getSampler().vectorSize;

            if (from.getSampler() == to2Sampler)
                return from.getSampler() != to1Sampler;
            if (from.getSampler() == to1Sampler)
                return false;
        }

        // Might or might not be changing shape, which means basic type might
        // or might not match, so within that, the question is how big a
        // basic-type conversion is being done.
        //
        // Use a hierarchy of domains, translated to order of magnitude
        // in a linearized view:
        //   - floating-point vs. integer
        //     - 32 vs. 64 bit (or width in general)
        //       - bool vs. non bool
        //         - signed vs. not signed
        const auto linearize = [](const TBasicType& basicType) -> int {
            switch (basicType) {
            case EbtBool:     return 1;
            case EbtInt:      return 10;
            case EbtUint:     return 11;
            case EbtInt64:    return 20;
            case EbtUint64:   return 21;
            case EbtFloat:    return 100;
            case EbtDouble:   return 110;
            default:          return 0;
            }
        };

        return abs(linearize(to2.getBasicType()) - linearize(from.getBasicType())) <
               abs(linearize(to1.getBasicType()) - linearize(from.getBasicType()));
    };

    // for ambiguity reporting
    bool tie = false;

    // send to the generic selector
    const TFunction* bestMatch = nullptr;

    // printf has var args and is in the symbol table as "printf()",
    // mangled to "printf("
    if (call.getName() == "printf") {
        TSymbol* symbol = symbolTable.find("printf(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    bestMatch = selectFunction(candidateList, call, convertible, better, tie);

    if (bestMatch == nullptr) {
        // If there is nothing selected by allowing only up-conversions (to a larger linearize() value),
        // we instead try down-conversions, which are valid in HLSL, but not preferred if there are any
        // upconversions possible.
        allowOnlyUpConversions = false;
        bestMatch = selectFunction(candidateList, call, convertible, better, tie);
    }

    if (bestMatch == nullptr) {
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");
        return nullptr;
    }

    // For built-ins, we can convert across the arguments.  This will happen in several steps:
    // Step 1:  If there's an exact match, use it.
    // Step 2a: Otherwise, get the operator from the best match and promote arguments:
    // Step 2b: reconstruct the TFunction based on the new arg types
    // Step 3:  Re-select after type promotion is applied, to find proper candidate.
    if (builtIn) {
        // Step 1: If there's an exact match, use it.
        if (call.getMangledName() == bestMatch->getMangledName())
            return bestMatch;

        // Step 2a: Otherwise, get the operator from the best match and promote arguments as if we
        // are that kind of operator.
        if (args != nullptr) {
            // The arg list can be a unary node, or an aggregate.  We have to handle both.
            // We will use the normal promote() facilities, which require an interm node.
            TIntermOperator* promote = nullptr;

            if (call.getParamCount() == 1) {
                promote = new TIntermUnary(bestMatch->getBuiltInOp());
                promote->getAsUnaryNode()->setOperand(args->getAsTyped());
            } else {
                promote = new TIntermAggregate(bestMatch->getBuiltInOp());
                promote->getAsAggregate()->getSequence().swap(args->getAsAggregate()->getSequence());
            }

            if (! intermediate.promote(promote))
                return nullptr;

            // Obtain the promoted arg list.
            if (call.getParamCount() == 1) {
                args = promote->getAsUnaryNode()->getOperand();
            } else {
                promote->getAsAggregate()->getSequence().swap(args->getAsAggregate()->getSequence());
            }
        }

        // Step 2b: reconstruct the TFunction based on the new arg types
        TFunction convertedCall(&call.getName(), call.getType(), call.getBuiltInOp());

        if (args->getAsAggregate()) {
            // Handle aggregates: put all args into the new function call
            for (int arg = 0; arg < int(args->getAsAggregate()->getSequence().size()); ++arg) {
                // TODO: But for constness, we could avoid the new & shallowCopy, and use the pointer directly.
                TParameter param = { nullptr, new TType, nullptr };
                param.type->shallowCopy(args->getAsAggregate()->getSequence()[arg]->getAsTyped()->getType());
                convertedCall.addParameter(param);
            }
        } else if (args->getAsUnaryNode()) {
            // Handle unaries: put all args into the new function call
            TParameter param = { nullptr, new TType, nullptr };
            param.type->shallowCopy(args->getAsUnaryNode()->getOperand()->getAsTyped()->getType());
            convertedCall.addParameter(param);
        } else if (args->getAsTyped()) {
            // Handle bare e.g, floats, not in an aggregate.
            TParameter param = { nullptr, new TType, nullptr };
            param.type->shallowCopy(args->getAsTyped()->getType());
            convertedCall.addParameter(param);
        } else {
            assert(0); // unknown argument list.
            return nullptr;
        }

        // Step 3: Re-select after type promotion, to find proper candidate
        // send to the generic selector
        bestMatch = selectFunction(candidateList, convertedCall, convertible, better, tie);

        // At this point, there should be no tie.
    }

    if (tie)
        error(loc, "ambiguous best function under implicit type conversion", call.getName().c_str(), "");

    // Append default parameter values if needed
    if (!tie && bestMatch != nullptr) {
        for (int defParam = call.getParamCount(); defParam < bestMatch->getParamCount(); ++defParam) {
            handleFunctionArgument(&call, args, (*bestMatch)[defParam].defaultValue);
        }
    }

    return bestMatch;
}